

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall JetHead::Socket::checkSocketHealth(Socket *this,uint32_t thresholdSeconds)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  socklen_t info_len;
  tcp_info info;
  socklen_t local_7c;
  undefined1 local_78 [2];
  byte local_76;
  byte local_75;
  byte local_74;
  uint local_40;
  
  iVar4 = 0;
  if (1 < thresholdSeconds) {
    iVar4 = 0;
    uVar3 = (ulong)thresholdSeconds;
    do {
      iVar4 = iVar4 + 1;
      uVar2 = (uint)uVar3;
      uVar3 = uVar3 >> 1;
    } while (3 < uVar2);
  }
  local_7c = 0x68;
  iVar1 = getsockopt(this->mFd,6,0xb,local_78,&local_7c);
  if (iVar1 == 0) {
    if ((iVar4 + 1U < (uint)local_76) && (thresholdSeconds * 1000 < local_40)) {
      jh_log_print(0,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x2f2,"failed for retransmits %d");
      iVar4 = 0x2f4;
    }
    else {
      if (local_75 == 0) {
        return 0;
      }
      if ((uint)local_74 + (uint)local_75 <= (uint)(iVar4 * 2)) {
        return 0;
      }
      if (local_40 <= thresholdSeconds * 1000) {
        return 0;
      }
      jh_log_print(0,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x300,"failed for probes %d");
      iVar4 = 0x302;
    }
    jh_log_print(2,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,iVar4,"last_ack_recv %d, backoff %d",(ulong)local_40,(uint)local_74);
    local_40 = local_40 / 1000;
  }
  else {
    jh_log_print(3,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x2e7,"failed to getsockopt TCP_INFO");
    local_40 = 0xffffffff;
  }
  return local_40;
}

Assistant:

int Socket::checkSocketHealth(uint32_t thresholdSeconds)
{
#ifdef PLATFORM_DARWIN
	return 0;
#else
	// Compute the log of the thresholdSeconds for use below
	uint8_t thresholdMagnitude = 0;
	for (uint32_t i = thresholdSeconds; i > 1; i /= 2, ++thresholdMagnitude);

	struct tcp_info info;
	socklen_t info_len = sizeof(info);

	if ( getsockopt(mFd, IPPROTO_TCP, TCP_INFO, &info, &info_len) )
	{
		LOG_WARN_PERROR("failed to getsockopt TCP_INFO");
		return -1;
	}

	// For the "sending" state: see if the number of outstanding
	// retransmits currently exceeds one more than the magnitude of
	// the threshold and if the last ack we have received from the
	// client is older than the threshold
	if (info.tcpi_retransmits > thresholdMagnitude + 1 &&
		info.tcpi_last_ack_recv > thresholdSeconds * 1000)
	{
		LOG_ERR("failed for retransmits %d", info.tcpi_retransmits);
		LOG_WARN("last_ack_recv %d, backoff %d",
				 info.tcpi_last_ack_recv, info.tcpi_backoff);
		return info.tcpi_last_ack_recv / 1000;
	}
	// For the "zero-window probe" state: See if we have missed any
	// probes, and if the total of missed probes and the backoff
	// exceeds twice the magnitude of the of the threshold, and if the
	// last ack we have received from the client is older than the
	// threshold
	if (info.tcpi_probes > 0 &&
		info.tcpi_probes + info.tcpi_backoff > thresholdMagnitude * 2 &&
		info.tcpi_last_ack_recv > thresholdSeconds * 1000)
	{
		LOG_ERR("failed for probes %d", info.tcpi_probes);
		LOG_WARN("last_ack_recv %d, backoff %d",
				 info.tcpi_last_ack_recv, info.tcpi_backoff);
		return info.tcpi_last_ack_recv / 1000;
	}
	
	// Socket health looks good *or* anything bad is still under threshold
	return 0;
#endif
}